

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.cpp
# Opt level: O0

void __thiscall xercesc_4_0::ComplexTypeInfo::~ComplexTypeInfo(ComplexTypeInfo *this)

{
  RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *this_00;
  XMLCh *p;
  ComplexTypeInfo *this_local;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__ComplexTypeInfo_00535de8;
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fTypeName);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fTypeLocalName);
  p = this->fTypeUri;
  (*this->fMemoryManager->_vptr_MemoryManager[4])();
  if (((this->fAdoptContentSpec & 1U) != 0) && (this->fContentSpec != (ContentSpecNode *)0x0)) {
    (*(this->fContentSpec->super_XSerializable)._vptr_XSerializable[1])();
  }
  if (this->fAttWildCard != (SchemaAttDef *)0x0) {
    (*(this->fAttWildCard->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1])();
  }
  this_00 = this->fAttDefs;
  if (this_00 != (RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *)0x0) {
    RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher>::~RefHash2KeysTableOf
              (this_00);
    XMemory::operator_delete((XMemory *)this_00,p);
  }
  if (this->fAttList != (SchemaAttDefList *)0x0) {
    (*(this->fAttList->super_XMLAttDefList).super_XSerializable._vptr_XSerializable[1])();
  }
  if (this->fElements != (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
    (*(this->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>)._vptr_BaseRefVectorOf
      [1])();
  }
  if (this->fLocator != (XSDLocator *)0x0) {
    (*(this->fLocator->super_Locator)._vptr_Locator[1])();
  }
  if (this->fContentModel != (XMLContentModel *)0x0) {
    (*this->fContentModel->_vptr_XMLContentModel[1])();
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fFormattedModel);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fContentSpecOrgURI);
  XSerializable::~XSerializable(&this->super_XSerializable);
  return;
}

Assistant:

ComplexTypeInfo::~ComplexTypeInfo()
{
    fMemoryManager->deallocate(fTypeName); //delete [] fTypeName;
    fMemoryManager->deallocate(fTypeLocalName); //delete [] fTypeLocalName;
    fMemoryManager->deallocate(fTypeUri); //delete [] fTypeUri;

    if (fAdoptContentSpec) {
        delete fContentSpec;
    }

    delete fAttWildCard;
    delete fAttDefs;
    delete fAttList;
    delete fElements;
    delete fLocator;

    delete fContentModel;
    fMemoryManager->deallocate(fFormattedModel); //delete [] fFormattedModel;
    fMemoryManager->deallocate(fContentSpecOrgURI); //delete [] fContentSpecOrgURI;

}